

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::Validator(Validator *this,Impl *loader)

{
  Impl *loader_local;
  Validator *this_local;
  
  this->loader = loader;
  Text::Reader::Reader(&this->nodeName);
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::TreeMap(&this->dependencies);
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::TreeMap(&this->members);
  kj::ArrayPtr<unsigned_short>::ArrayPtr(&this->membersByDiscriminant);
  return;
}

Assistant:

Validator(SchemaLoader::Impl& loader): loader(loader) {}